

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

ResourceBundle * __thiscall
icu_63::ResourceBundle::getNext
          (ResourceBundle *__return_storage_ptr__,ResourceBundle *this,UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_e8 [8];
  UResourceBundle r;
  UErrorCode *status_local;
  ResourceBundle *this_local;
  ResourceBundle *res;
  
  r._192_8_ = status;
  ures_initStackObject_63((UResourceBundle *)local_e8);
  ures_getNextResource_63(this->fResource,(UResourceBundle *)local_e8,(UErrorCode *)r._192_8_);
  ResourceBundle(__return_storage_ptr__,(UResourceBundle *)local_e8,(UErrorCode *)r._192_8_);
  UVar1 = ::U_SUCCESS(*(UErrorCode *)r._192_8_);
  if (UVar1 != '\0') {
    ures_close_63((UResourceBundle *)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceBundle ResourceBundle::getNext(UErrorCode& status) {
    UResourceBundle r;

    ures_initStackObject(&r);
    ures_getNextResource(fResource, &r, &status);
    ResourceBundle res(&r, status);
    if (U_SUCCESS(status)) {
        ures_close(&r);
    }
    return res;
}